

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t farmhash64_with_seeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  uint64_t in_RCX;
  size_t in_RDX;
  char *in_RSI;
  uint64_t in_stack_ffffffffffffffd8;
  
  uVar1 = farmhash64_na_with_seeds(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  uVar1 = debug_tweak64(uVar1);
  return uVar1;
}

Assistant:

uint64_t farmhash64_with_seeds(const char* s, size_t len, uint64_t seed0, uint64_t seed1) {
  return debug_tweak64(farmhash64_na_with_seeds(s, len, seed0, seed1));
}